

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper::RunImpl
          (initiatorFixtureLoginTargetCompID_RequiredFieldMissing_NoLogonHelper *this)

{
  _func_int **pp_Var1;
  Message *pMVar2;
  Session *pSVar3;
  TestResults *this_00;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  Logon local_428;
  Message receivedLogon;
  undefined1 local_260 [232];
  Message sentLogon;
  int local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,8,8,8,0xd,5,0x7df);
  *(ulong *)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
             super_DateTime.m_date = CONCAT44(uStack_16c,local_170);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = CONCAT44(uStack_164,uStack_168);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = local_170;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.field_0xc = uStack_16c;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.m_time = uStack_168;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
           super_DateTime.m_time + 4) = uStack_164;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  pp_Var1 = (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
            _vptr_Responder;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*pp_Var1[8])(this,1,0,0x1f);
  createLogon((Logon *)&receivedLogon,"TW","ISLD",1);
  FIX::Message::Message(&sentLogon,&receivedLogon);
  FIX::Message::~Message(&receivedLogon);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_428,"ISLD","TW",1);
  FIX::Message::Message(&receivedLogon,(Message *)&local_428);
  FIX::Message::~Message((Message *)&local_428);
  FIX::FieldMap::removeField((int)local_260);
  pMVar2 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_428);
  FIX::Session::next(pMVar2,(UtcTimeStamp *)&receivedLogon,SUB81(&local_428,0));
  pSVar3 = (this->super_initiatorFixture).super_sessionFixture.object;
  if ((pSVar3[0x261] == (Session)0x1) && (((byte)pSVar3[0x263] & 1) != 0)) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&local_428,*ppTVar5,0x9ae);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)&local_428,"!object->isLoggedOn()");
  }
  FIX::Message::~Message(&receivedLogon);
  FIX::Message::~Message(&sentLogon);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LoginTargetCompID_RequiredFieldMissing_NoLogon)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  receivedLogon.getHeader().removeField(FIELD::TargetCompID);
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(!object->isLoggedOn());
}